

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

unique_ptr<Catch::CumulativeReporterBase::SectionNode> __thiscall
Catch::Detail::make_unique<Catch::CumulativeReporterBase::SectionNode,Catch::SectionStats&>
          (Detail *this,SectionStats *args)

{
  pointer pcVar1;
  size_t sVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  string *psVar8;
  
  psVar8 = (string *)operator_new(0xd0);
  *(string **)psVar8 = psVar8 + 0x10;
  pcVar1 = (args->sectionInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            (psVar8,pcVar1,pcVar1 + (args->sectionInfo).name._M_string_length);
  sVar2 = (args->sectionInfo).lineInfo.line;
  *(char **)(psVar8 + 0x20) = (args->sectionInfo).lineInfo.file;
  *(size_t *)(psVar8 + 0x28) = sVar2;
  uVar3 = (args->assertions).failed;
  uVar4 = (args->assertions).failedButOk;
  uVar5 = (args->assertions).skipped;
  uVar6 = *(undefined8 *)((long)&(args->assertions).skipped + 1);
  uVar7 = *(undefined8 *)((long)&args->durationInSeconds + 1);
  *(uint64_t *)(psVar8 + 0x30) = (args->assertions).passed;
  *(uint64_t *)(psVar8 + 0x38) = uVar3;
  *(uint64_t *)(psVar8 + 0x40) = uVar4;
  *(uint64_t *)(psVar8 + 0x48) = uVar5;
  *(undefined8 *)(psVar8 + 0x49) = uVar6;
  *(undefined8 *)(psVar8 + 0x51) = uVar7;
  *(undefined8 *)(psVar8 + 0x60) = 0;
  *(undefined8 *)(psVar8 + 0x68) = 0;
  *(undefined8 *)(psVar8 + 0x70) = 0;
  *(undefined8 *)(psVar8 + 0x78) = 0;
  *(undefined8 *)(psVar8 + 0x80) = 0;
  *(undefined8 *)(psVar8 + 0x88) = 0;
  *(string **)(psVar8 + 0x90) = psVar8 + 0xa0;
  *(undefined8 *)(psVar8 + 0x98) = 0;
  psVar8[0xa0] = (string)0x0;
  *(string **)(psVar8 + 0xb0) = psVar8 + 0xc0;
  *(undefined8 *)(psVar8 + 0xb8) = 0;
  psVar8[0xc0] = (string)0x0;
  *(string **)this = psVar8;
  return (unique_ptr<Catch::CumulativeReporterBase::SectionNode>)(SectionNode *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }